

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapistd.c
# Opt level: O0

JDIMENSION jpeg_write_raw_data(j_compress_ptr cinfo,JSAMPIMAGE data,JDIMENSION num_lines)

{
  int iVar1;
  uint in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  JDIMENSION lines_per_iMCU_row;
  uint local_4;
  
  if (*(int *)((long)in_RDI + 0x24) != 0x66) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(uint *)(in_RDI + 0x26) < *(uint *)((long)in_RDI + 0x34)) {
    if (in_RDI[2] != 0) {
      *(ulong *)(in_RDI[2] + 8) = (ulong)*(uint *)(in_RDI + 0x26);
      *(ulong *)(in_RDI[2] + 0x10) = (ulong)*(uint *)((long)in_RDI + 0x34);
      (**(code **)in_RDI[2])(in_RDI);
    }
    if (*(int *)(in_RDI[0x36] + 0x18) != 0) {
      (**(code **)(in_RDI[0x36] + 8))(in_RDI);
    }
    local_4 = *(int *)((long)in_RDI + 0x13c) * 8;
    if (in_EDX < local_4) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x17;
      (**(code **)*in_RDI)(in_RDI);
    }
    iVar1 = (**(code **)(in_RDI[0x39] + 8))(in_RDI,in_RSI);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      *(uint *)(in_RDI + 0x26) = local_4 + (int)in_RDI[0x26];
    }
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x7b;
    (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_write_raw_data(j_compress_ptr cinfo, JSAMPIMAGE data,
                    JDIMENSION num_lines)
{
  JDIMENSION lines_per_iMCU_row;

  if (cinfo->global_state != CSTATE_RAW_OK)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->next_scanline >= cinfo->image_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long)cinfo->next_scanline;
    cinfo->progress->pass_limit = (long)cinfo->image_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr)cinfo);
  }

  /* Give master control module another chance if this is first call to
   * jpeg_write_raw_data.  This lets output of the frame/scan headers be
   * delayed so that application can write COM, etc, markers between
   * jpeg_start_compress and jpeg_write_raw_data.
   */
  if (cinfo->master->call_pass_startup)
    (*cinfo->master->pass_startup) (cinfo);

  /* Verify that at least one iMCU row has been passed. */
  lines_per_iMCU_row = cinfo->max_v_samp_factor * DCTSIZE;
  if (num_lines < lines_per_iMCU_row)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);

  /* Directly compress the row. */
  if (!(*cinfo->coef->compress_data) (cinfo, data)) {
    /* If compressor did not consume the whole row, suspend processing. */
    return 0;
  }

  /* OK, we processed one iMCU row. */
  cinfo->next_scanline += lines_per_iMCU_row;
  return lines_per_iMCU_row;
}